

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worm.c
# Opt level: O2

void remove_worm(monst *worm)

{
  wseg *pwVar1;
  
  if ((ulong)worm->wormno != 0) {
    pwVar1 = (wseg *)(level->wtails + worm->wormno);
    while (pwVar1 = pwVar1->nseg, pwVar1 != (wseg *)0x0) {
      remove_monster(level,(int)pwVar1->wx,(int)pwVar1->wy);
      newsym((int)pwVar1->wx,(int)pwVar1->wy);
    }
    return;
  }
  warning("remove_worm: worm->wormno was 0");
  return;
}

Assistant:

void remove_worm(struct monst *worm)
{
    struct wseg *curr = level->wtails[worm->wormno];

    if (!worm->wormno) {
	warning("remove_worm: worm->wormno was 0");
	return;
    }

    while (curr) {
	remove_monster(level, curr->wx, curr->wy);
	newsym(curr->wx, curr->wy);
	curr = curr->nseg;
    }
}